

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O0

EGLNativeDisplayType __thiscall eglu::NativeDisplay::getLegacyNative(NativeDisplay *this)

{
  deBool dVar1;
  InternalError *this_00;
  NotSupportedError *this_01;
  NativeDisplay *this_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((this->m_capabilities & CAPABILITY_GET_DISPLAY_LEGACY) != 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"eglu::NativeDisplay can\'t be used with eglGetDisplay()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeDisplay.cpp"
                 ,0x3d);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"(m_capabilities & CAPABILITY_GET_DISPLAY_LEGACY) == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeDisplay.cpp"
             ,0x3c);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

EGLNativeDisplayType NativeDisplay::getLegacyNative (void)
{
	// If NativeDisplay claims to support CAPABILITY_GET_DISPLAY_LEGACY then
	// this method must be implemented.
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_GET_DISPLAY_LEGACY) == 0);
	TCU_THROW(NotSupportedError, "eglu::NativeDisplay can't be used with eglGetDisplay()");
}